

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootwindow.cpp
# Opt level: O2

void __thiscall RootWindow::closeExample(RootWindow *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  float *pfVar1;
  undefined1 local_68 [8];
  shared_ptr<rengine::Animation_Callback<RootWindow,_&RootWindow::exampleClosed>_> close;
  vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
  sequence;
  undefined1 local_38 [8];
  shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>_>
  fade;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  if (this->m_example != (Example *)0x0) {
    animateButtons(this,this->m_example,1.5707964,0.0,0.3);
    close.
    super___shared_ptr<rengine::Animation_Callback<RootWindow,_&RootWindow::exampleClosed>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::
    make_shared<rengine::Animation<rengine::OpacityNode,float,&rengine::OpacityNode::setOpacity,&rengine::AnimationCurves::smooth>,rengine::OpacityNode*&>
              ((OpacityNode **)local_38);
    rengine::AbstractAnimation::setDuration((AbstractAnimation *)local_38,0.5);
    pfVar1 = rengine::
             Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
             ::newKeyFrame((Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
                            *)local_38,0.0);
    *pfVar1 = 1.0;
    pfVar1 = rengine::
             Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
             ::newKeyFrame((Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
                            *)local_38,1.0);
    *pfVar1 = 0.0;
    fade.
    super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    std::make_shared<rengine::Animation_Callback<RootWindow,&RootWindow::exampleClosed>,RootWindow*>
              ((RootWindow **)local_68);
    this_00 = &fade.
               super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
    std::__shared_ptr<rengine::AbstractAnimation,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<rengine::Animation<rengine::OpacityNode,float,&rengine::OpacityNode::setOpacity,&rengine::AnimationCurves::smooth>,void>
              ((__shared_ptr<rengine::AbstractAnimation,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                *)local_38);
    std::
    vector<std::shared_ptr<rengine::AbstractAnimation>,std::allocator<std::shared_ptr<rengine::AbstractAnimation>>>
    ::emplace_back<std::shared_ptr<rengine::AbstractAnimation>>
              ((vector<std::shared_ptr<rengine::AbstractAnimation>,std::allocator<std::shared_ptr<rengine::AbstractAnimation>>>
                *)&close.
                   super___shared_ptr<rengine::Animation_Callback<RootWindow,_&RootWindow::exampleClosed>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,(shared_ptr<rengine::AbstractAnimation> *)this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
    std::__shared_ptr<rengine::AbstractAnimation,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<rengine::Animation_Callback<RootWindow,&RootWindow::exampleClosed>,void>
              ((__shared_ptr<rengine::AbstractAnimation,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<rengine::Animation_Callback<RootWindow,_&RootWindow::exampleClosed>,_(__gnu_cxx::_Lock_policy)2>
                *)local_68);
    std::
    vector<std::shared_ptr<rengine::AbstractAnimation>,std::allocator<std::shared_ptr<rengine::AbstractAnimation>>>
    ::emplace_back<std::shared_ptr<rengine::AbstractAnimation>>
              ((vector<std::shared_ptr<rengine::AbstractAnimation>,std::allocator<std::shared_ptr<rengine::AbstractAnimation>>>
                *)&close.
                   super___shared_ptr<rengine::Animation_Callback<RootWindow,_&RootWindow::exampleClosed>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,(shared_ptr<rengine::AbstractAnimation> *)this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
    rengine::AnimationManager::start
              (&(this->super_StandardSurface).m_animationManager,
               (vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
                *)&close.
                   super___shared_ptr<rengine::Animation_Callback<RootWindow,_&RootWindow::exampleClosed>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,0.0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&close);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fade);
    std::
    vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
    ::~vector((vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
               *)&close.
                  super___shared_ptr<rengine::Animation_Callback<RootWindow,_&RootWindow::exampleClosed>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    return;
  }
  __assert_fail("m_example",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/examples/rootwindow.cpp"
                ,0x83,"void RootWindow::closeExample()");
}

Assistant:

void RootWindow::closeExample()
{
    assert(m_example);

    animateButtons(m_example, M_PI / 2.0f, 0, 0.3);

    std::vector<std::shared_ptr<AbstractAnimation>> sequence;

    auto fade = std::make_shared<Animation_OpacityNode_opacity>(m_appLayer);
    fade->setDuration(0.5);
    fade->newKeyFrame(0) = 1;
    fade->newKeyFrame(1) = 0;

    auto close = std::make_shared<Animation_Callback<RootWindow, &RootWindow::exampleClosed>>(this);

    sequence.push_back(fade);
    sequence.push_back(close);

    animationManager()->start(sequence, 0);
}